

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all-to-all.hpp
# Opt level: O2

void __thiscall
diy::detail::
AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>::
AllToAllReduce(AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
               *this,Exchanger *op_,Assigner *assigner)

{
  value_type in_RAX;
  int gid;
  uint uVar1;
  BlockID nbr;
  value_type local_38;
  
  this->op = op_;
  (this->all_neighbors_link).super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__0014e400;
  (this->all_neighbors_link).neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->all_neighbors_link).neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->all_neighbors_link).neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->empty_link).super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__0014e400;
  (this->empty_link).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->empty_link).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->empty_link).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = in_RAX;
  for (uVar1 = 0; (int)uVar1 < assigner->nblocks_; uVar1 = uVar1 + 1) {
    local_38.proc = (*assigner->_vptr_Assigner[3])(assigner,(ulong)uVar1);
    local_38.gid = uVar1;
    std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back
              (&(this->all_neighbors_link).neighbors_,&local_38);
  }
  return;
}

Assistant:

AllToAllReduce(const Op& op_, const Assigner& assigner):
             op(op_)
    {
      for (int gid = 0; gid < assigner.nblocks(); ++gid)
      {
        BlockID nbr = { gid, assigner.rank(gid) };
        all_neighbors_link.add_neighbor(nbr);
      }
    }